

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O1

void __thiscall
cornerstone::raft_server::handle_append_entries_resp(raft_server *this,resp_msg *resp)

{
  mutex *__mutex;
  peer *p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  ulong uVar2;
  long lVar3;
  pointer puVar4;
  int iVar5;
  _Hash_node_base *p_Var6;
  size_t sVar7;
  undefined4 extraout_var;
  ulong uVar8;
  undefined4 extraout_var_00;
  pointer puVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  bool bVar13;
  bool bVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> matched_indexes;
  long *local_c0 [2];
  long local_b0 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0 [4];
  char *local_38;
  
  std::__shared_mutex_pthread::lock_shared(&(this->peers_lock_).super___shared_timed_mutex_base);
  iVar5 = (resp->super_msg_base).src_;
  uVar8 = (this->peers_)._M_h._M_bucket_count;
  uVar10 = (ulong)(long)iVar5 % uVar8;
  p_Var11 = (this->peers_)._M_h._M_buckets[uVar10];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var11 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var11->_M_nxt, p_Var12 = p_Var11, iVar5 != *(int *)&p_Var11->_M_nxt[1]._M_nxt)) {
    while (p_Var11 = p_Var6, p_Var6 = p_Var11->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var6[1]._M_nxt % uVar8 != uVar10) ||
         (p_Var12 = p_Var11, iVar5 == *(int *)&p_Var6[1]._M_nxt)) goto LAB_0015114d;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_0015114d:
  if (p_Var12 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var12->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38 = "the response is from an unkonw peer %d";
    snprintf((char *)local_a0,100,"the response is from an unkonw peer %d");
    local_c0[0] = local_b0;
    sVar7 = strlen((char *)local_a0);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,local_a0,
               (long)&local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + sVar7);
    (*peVar1->_vptr_logger[3])(peVar1,local_c0);
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0],local_b0[0] + 1);
    }
    goto LAB_0015138a;
  }
  p = (peer *)p_Var6[2]._M_nxt;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[3]._M_nxt;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  bVar13 = resp->accepted_;
  __mutex = &p->lock_;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (bVar13 == true) {
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    uVar2 = resp->next_idx_;
    p->next_log_idx_ = uVar2;
    p->matched_idx_ = uVar2 - 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (local_a0,(this->peers_)._M_h._M_element_count + 1,(allocator_type *)local_c0);
    iVar5 = (*((this->log_store_).
               super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_log_store[2])();
    puVar4 = local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    *local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = CONCAT44(extraout_var,iVar5) - 1;
    puVar9 = local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (p_Var6 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      puVar9 = puVar9 + 1;
      *puVar9 = (unsigned_long)p_Var6[2]._M_nxt[9]._M_nxt;
    }
    if (local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar8 = (long)local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar3 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                (local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                (puVar4,local_a0[0].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    }
    commit(this,*(ulong *)((long)local_a0[0].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start +
                          ((this->peers_)._M_h._M_element_count * 4 + 4 & 0xfffffffffffffff8)));
    bVar13 = false;
    LOCK();
    bVar14 = (p->pending_commit_flag_)._M_base._M_i == true;
    if (bVar14) {
      (p->pending_commit_flag_)._M_base._M_i = false;
    }
    UNLOCK();
    if (!bVar14) {
      uVar8 = resp->next_idx_;
      iVar5 = (*((this->log_store_).
                 super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      bVar13 = CONCAT44(extraout_var_00,iVar5) <= uVar8;
    }
    if (local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0[0].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0[0].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    uVar8 = resp->next_idx_;
    if ((uVar8 == 0) || (p->next_log_idx_ <= uVar8)) {
      if (p->next_log_idx_ != 0) {
        uVar8 = p->next_log_idx_ - 1;
        goto LAB_00151356;
      }
    }
    else {
LAB_00151356:
      p->next_log_idx_ = uVar8;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    bVar13 = false;
  }
  if ((!bVar13) && (this->role_ == leader)) {
    request_append_entries(this,p);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_0015138a:
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->peers_lock_);
  return;
}

Assistant:

void raft_server::handle_append_entries_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        {
            auto_lock(p->get_lock());
            p->set_next_log_idx(resp.get_next_idx());
            p->set_matched_idx(resp.get_next_idx() - 1);
        }

        // try to commit with this response
        std::vector<ulong> matched_indexes(peers_.size() + 1);
        matched_indexes[0] = log_store_->next_slot() - 1;
        int i = 1;
        for (it = peers_.begin(); it != peers_.end(); ++it, i++)
        {
            matched_indexes[i] = it->second->get_matched_idx();
        }

        std::sort(matched_indexes.begin(), matched_indexes.end(), std::greater<ulong>());
        commit(matched_indexes[(peers_.size() + 1) / 2]);
        need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
    }
    else
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        if (resp.get_next_idx() > 0 && p->get_next_log_idx() > resp.get_next_idx())
        {
            // fast move for the peer to catch up
            p->set_next_log_idx(resp.get_next_idx());
        }
        else if (p->get_next_log_idx() > 0)
        {
            p->set_next_log_idx(p->get_next_log_idx() - 1);
        }
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}